

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_print_visitor.cpp
# Opt level: O1

void __thiscall ir_print_visitor::visit(ir_print_visitor *this,ir_return *ir)

{
  ir_rvalue *piVar1;
  
  fwrite("(return",7,1,(FILE *)this->f);
  piVar1 = ir->value;
  if (piVar1 != (ir_rvalue *)0x0) {
    fputc(0x20,(FILE *)this->f);
    (*(piVar1->super_ir_instruction)._vptr_ir_instruction[2])(piVar1,this);
  }
  fputc(0x29,(FILE *)this->f);
  return;
}

Assistant:

void
ir_print_visitor::visit(ir_return *ir)
{
   fprintf(f, "(return");

   ir_rvalue *const value = ir->get_value();
   if (value) {
      fprintf(f, " ");
      value->accept(this);
   }

   fprintf(f, ")");
}